

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> * __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>::
findNode<QHttp2Stream*>
          (Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
           *this,QHttp2Stream **key)

{
  long lVar1;
  bool bVar2;
  Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *pNVar3;
  QHttp2Stream **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QHttp2Stream*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
          ::Bucket::isUnused((Bucket *)0x2e043b);
  if (bVar2) {
    pNVar3 = (Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
             ::Bucket::node((Bucket *)0x2e0456);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }